

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int flags,char *pText,int nText,
                      char *pLoc,int nLoc,_func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  long in_FS_OFFSET;
  PorterTokenizer *p;
  PorterContext sCtx;
  undefined1 local_28 [16];
  long local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_RDI + 0x28;
  iVar1 = (**(code **)(in_RDI + 0x18))
                    (*(undefined8 *)(in_RDI + 0x20),local_28,in_EDX,in_RCX,in_R8D,in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5PorterTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int flags,
  const char *pText, int nText,
  const char *pLoc, int nLoc,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  PorterTokenizer *p = (PorterTokenizer*)pTokenizer;
  PorterContext sCtx;
  sCtx.xToken = xToken;
  sCtx.pCtx = pCtx;
  sCtx.aBuf = p->aBuf;
  return p->tokenizer_v2.xTokenize(
      p->pTokenizer, (void*)&sCtx, flags, pText, nText, pLoc, nLoc, fts5PorterCb
  );
}